

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_light_calib.cpp
# Opt level: O1

void lightPlainFitting(structure_light *light)

{
  float fVar1;
  float fVar2;
  float fVar3;
  pointer pPVar4;
  pointer pPVar5;
  long lVar6;
  long lVar7;
  float *pfVar8;
  char *__s;
  size_t sVar9;
  long *plVar10;
  long lVar11;
  undefined1 auVar12 [16];
  Mat B;
  Mat A;
  Mat X;
  _InputArray local_2d0;
  undefined1 local_2b8 [16];
  Size local_2a8;
  Mat local_248 [96];
  Mat local_1e8 [144];
  Mat local_158 [16];
  double *local_148;
  long *local_110;
  Mat local_f8 [16];
  double *local_e8;
  long *local_b0;
  Mat local_98 [16];
  double *local_88;
  long *local_50;
  _OutputArray local_38;
  
  cv::Mat::zeros((int)local_2b8,3,3);
  cv::Mat::Mat(local_f8);
  (**(code **)(*(long *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_) + 0x18))
            ((long *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),local_2b8,local_f8,0xffffffff);
  cv::Mat::~Mat(local_1e8);
  cv::Mat::~Mat(local_248);
  cv::Mat::~Mat((Mat *)(local_2b8 + 0x10));
  cv::Mat::zeros((int)local_2b8,3,1);
  cv::Mat::Mat(local_158);
  (**(code **)(*(long *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_) + 0x18))
            ((long *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),local_2b8,local_158,0xffffffff);
  cv::Mat::~Mat(local_1e8);
  cv::Mat::~Mat(local_248);
  cv::Mat::~Mat((Mat *)(local_2b8 + 0x10));
  cv::Mat::zeros((int)local_2b8,3,1);
  cv::Mat::Mat(local_98);
  (**(code **)(*(long *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_) + 0x18))
            ((long *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_),local_2b8,local_98,0xffffffff);
  cv::Mat::~Mat(local_1e8);
  cv::Mat::~Mat(local_248);
  cv::Mat::~Mat((Mat *)(local_2b8 + 0x10));
  pPVar4 = (light->lightPlanePoint).
           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  pPVar5 = (light->lightPlanePoint).
           super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar11 = ((long)pPVar5 - (long)pPVar4 >> 2) * -0x5555555555555555;
  auVar12._8_4_ = (int)((ulong)lVar11 >> 0x20);
  auVar12._0_8_ = lVar11;
  auVar12._12_4_ = 0x45300000;
  lVar6 = *local_b0;
  *(double *)((long)local_e8 + lVar6 * 2 + 0x10) =
       (auVar12._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0);
  if (pPVar5 != pPVar4) {
    lVar7 = *local_110;
    lVar11 = lVar11 + (ulong)(lVar11 == 0);
    pfVar8 = &pPVar4->z;
    do {
      fVar1 = ((Point3_<float> *)(pfVar8 + -2))->x;
      *local_e8 = (double)(fVar1 * fVar1) + *local_e8;
      fVar2 = pfVar8[-1];
      local_e8[1] = local_e8[1] + (double)(fVar1 * fVar2);
      local_e8[2] = local_e8[2] + (double)fVar1;
      *(double *)((long)local_e8 + lVar6) =
           (double)(fVar1 * fVar2) + *(double *)((long)local_e8 + lVar6);
      *(double *)((long)local_e8 + lVar6 + 8) =
           (double)(fVar2 * fVar2) + *(double *)((long)local_e8 + lVar6 + 8);
      *(double *)((long)local_e8 + lVar6 + 0x10) =
           *(double *)((long)local_e8 + lVar6 + 0x10) + (double)fVar2;
      *(double *)((long)local_e8 + lVar6 * 2) =
           (double)fVar1 + *(double *)((long)local_e8 + lVar6 * 2);
      *(double *)((long)local_e8 + lVar6 * 2 + 8) =
           (double)fVar2 + *(double *)((long)local_e8 + lVar6 * 2 + 8);
      fVar3 = *pfVar8;
      *local_148 = (double)(fVar1 * fVar3) + *local_148;
      *(double *)((long)local_148 + lVar7) =
           (double)(fVar2 * fVar3) + *(double *)((long)local_148 + lVar7);
      *(double *)((long)local_148 + lVar7 * 2) =
           (double)fVar3 + *(double *)((long)local_148 + lVar7 * 2);
      pfVar8 = pfVar8 + 3;
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  local_2a8.width = 0;
  local_2a8.height = 0;
  local_2b8._0_4_ = 0x1010000;
  local_2d0.sz.width = 0;
  local_2d0.sz.height = 0;
  local_2d0.flags = 0x1010000;
  local_38.super__InputArray.sz.width = 0;
  local_38.super__InputArray.sz.height = 0;
  local_38.super__InputArray.flags = 0x2010000;
  local_2d0.obj = local_158;
  local_2b8._8_8_ = local_f8;
  local_38.super__InputArray.obj = local_98;
  cv::solve((_InputArray *)local_2b8,&local_2d0,&local_38,0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"X:",2);
  cv::Formatter::get(&local_2d0,0);
  (**(code **)(*(long *)CONCAT44(local_2d0._4_4_,local_2d0.flags) + 0x10))
            (local_2b8,(long *)CONCAT44(local_2d0._4_4_,local_2d0.flags),local_98);
  (**(code **)(*(long *)CONCAT44(local_2b8._4_4_,local_2b8._0_4_) + 8))();
  __s = (char *)(*(code *)**(undefined8 **)CONCAT44(local_2b8._4_4_,local_2b8._0_4_))();
  while (__s != (char *)0x0) {
    sVar9 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar9);
    __s = (char *)(*(code *)**(undefined8 **)CONCAT44(local_2b8._4_4_,local_2b8._0_4_))();
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2b8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0.obj !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d0.obj);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
  std::ostream::put(-0x38);
  plVar10 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  light->planeFormular[0] = -*local_88;
  lVar6 = *local_50;
  light->planeFormular[1] = -*(double *)((long)local_88 + lVar6);
  light->planeFormular[2] = 1.0;
  light->planeFormular[3] = *(double *)((long)local_88 + lVar6 * 2);
  cv::Mat::~Mat(local_98);
  cv::Mat::~Mat(local_158);
  cv::Mat::~Mat(local_f8);
  return;
}

Assistant:

void lightPlainFitting(structure_light &light)
{
    Mat A = Mat::zeros(3, 3, CV_64FC1);//定义拟合所需要的三个矩阵
    Mat B = Mat::zeros(3, 1, CV_64FC1);
    Mat X = Mat::zeros(3, 1, CV_64FC1);

    A.at<double>(2, 2) = light.lightPlanePoint.size();
    for (int i = 0; i < light.lightPlanePoint.size(); i++)
    {
        A.at<double>(0, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].x;
        A.at<double>(0, 1) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].y;
        A.at<double>(0, 2) += light.lightPlanePoint[i].x;
        A.at<double>(1, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].y;
        A.at<double>(1, 1) += light.lightPlanePoint[i].y*light.lightPlanePoint[i].y;
        A.at<double>(1, 2) += light.lightPlanePoint[i].y;
        A.at<double>(2, 0) += light.lightPlanePoint[i].x;
        A.at<double>(2, 1) += light.lightPlanePoint[i].y;
        B.at<double>(0, 0) += light.lightPlanePoint[i].x*light.lightPlanePoint[i].z;
        B.at<double>(1, 0) += light.lightPlanePoint[i].y*light.lightPlanePoint[i].z;
        B.at<double>(2, 0) += light.lightPlanePoint[i].z;
    }

    solve(A, B, X);

    cout << "X:" << X << endl << endl;

    light.planeFormular[0] = -X.at<double>(0, 0);//x
    light.planeFormular[1] = -X.at<double>(1, 0);//y
    light.planeFormular[2] = 1;//z
    light.planeFormular[3] = X.at<double>(2, 0);//常数项
}